

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofRAngle2.cpp
# Opt level: O3

void __thiscall
OpenMD::GofRAngle2::processNonOverlapping
          (GofRAngle2 *this,SelectionManager *sman1,SelectionManager *sman2)

{
  int iVar1;
  int iVar2;
  StuntDouble *pSVar3;
  StuntDouble *pSVar4;
  StuntDouble *pSVar5;
  long lVar6;
  int k;
  int i;
  int j;
  int local_60;
  int local_5c;
  SelectionManager *local_58;
  int local_4c;
  SelectionSet local_48;
  
  if (this->doSele3_ == true) {
    if ((this->evaluator3_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_48,&this->evaluator3_);
      lVar6 = 0;
      do {
        std::vector<bool,_std::allocator<bool>_>::operator=
                  ((vector<bool,_std::allocator<bool>_> *)
                   ((long)&(((this->seleMan3_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar6),
                   (vector<bool,_std::allocator<bool>_> *)
                   ((long)&((local_48.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar6))
        ;
        lVar6 = lVar6 + 0x28;
      } while (lVar6 != 0xf0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_48.bitsets_);
    }
    iVar1 = OpenMDBitSet::countBits
                      ((sman1->ss_).bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    local_58 = &this->seleMan3_;
    iVar2 = OpenMDBitSet::countBits
                      ((this->seleMan3_).ss_.bitsets_.
                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (iVar1 != iVar2) {
      RadialDistrFunc::processNonOverlapping(&this->super_RadialDistrFunc,sman1,sman2);
    }
    pSVar3 = SelectionManager::beginSelected(sman1,&local_5c);
    pSVar4 = SelectionManager::beginSelected(local_58,&local_60);
    if (pSVar4 != (StuntDouble *)0x0 && pSVar3 != (StuntDouble *)0x0) {
      do {
        pSVar5 = SelectionManager::beginSelected(sman2,&local_4c);
        while (pSVar5 != (StuntDouble *)0x0) {
          (*(this->super_RadialDistrFunc).super_StaticAnalyser._vptr_StaticAnalyser[0xe])
                    (this,pSVar3,pSVar5,pSVar4);
          pSVar5 = SelectionManager::nextSelected(sman2,&local_4c);
        }
        pSVar3 = SelectionManager::nextSelected(sman1,&local_5c);
        pSVar4 = SelectionManager::nextSelected(local_58,&local_60);
      } while ((pSVar4 != (StuntDouble *)0x0) && (pSVar3 != (StuntDouble *)0x0));
    }
    return;
  }
  RadialDistrFunc::processNonOverlapping(&this->super_RadialDistrFunc,sman1,sman2);
  return;
}

Assistant:

void GofRAngle2::processNonOverlapping(SelectionManager& sman1,
                                         SelectionManager& sman2) {
    StuntDouble* sd1;
    StuntDouble* sd2;
    StuntDouble* sd3;
    int i;
    int j;
    int k;

    // This is the same as a non-overlapping pairwise loop structure:
    // for (int i = 0;  i < ni ; ++i ) {
    //   for (int j = 0; j < nj; ++j) {}
    // }

    if (doSele3_) {
      if (evaluator3_.isDynamic()) {
        seleMan3_.setSelectionSet(evaluator3_.evaluate());
      }
      if (sman1.getSelectionCount() != seleMan3_.getSelectionCount()) {
        RadialDistrFunc::processNonOverlapping(sman1, sman2);
      }

      for (sd1 = sman1.beginSelected(i), sd3 = seleMan3_.beginSelected(k);
           sd1 != NULL && sd3 != NULL;
           sd1 = sman1.nextSelected(i), sd3 = seleMan3_.nextSelected(k)) {
        for (sd2 = sman2.beginSelected(j); sd2 != NULL;
             sd2 = sman2.nextSelected(j)) {
          collectHistogram(sd1, sd2, sd3);
        }
      }
    } else {
      RadialDistrFunc::processNonOverlapping(sman1, sman2);
    }
  }